

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O1

void storerequest(char *reqbuf,size_t totalsize)

{
  uint __errnum;
  int iVar1;
  FILE *__s;
  uint *puVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  size_t __n;
  bool bVar6;
  
  if (totalsize != 0 && reqbuf != (char *)0x0) {
    __s = fopen64("log/server.input","ab");
    uVar5 = 0;
    bVar6 = __s == (FILE *)0x0;
    if (bVar6) {
      puVar2 = (uint *)__errno_location();
      uVar5 = *puVar2;
      while (uVar5 == 4) {
        __s = fopen64("log/server.input","ab");
        bVar6 = __s == (FILE *)0x0;
        if (!bVar6) {
          uVar5 = 4;
          break;
        }
        uVar5 = *puVar2;
      }
    }
    __n = totalsize;
    if (bVar6) {
      pcVar3 = strerror(uVar5);
      logmsg("Error opening file %s error: %d %s","log/server.input",(ulong)uVar5,pcVar3);
      logmsg("Failed to write request input to log/server.input");
      return;
    }
    do {
      sVar4 = fwrite(reqbuf + (totalsize - __n),1,__n,__s);
      if (got_exit_signal != 0) goto LAB_00107315;
      __n = __n - sVar4;
      __errnum = uVar5;
      if (__n == 0) break;
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      uVar5 = 4;
    } while (__errnum == 4);
    uVar5 = __errnum;
    if (__n == 0) {
      logmsg("Wrote request (%zu bytes) input to log/server.input",totalsize);
    }
    else {
      pcVar3 = strerror(__errnum);
      logmsg("Error writing file %s error: %d %s","log/server.input",(ulong)__errnum,pcVar3);
      logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",totalsize - __n,totalsize,
             "log/server.input");
    }
LAB_00107315:
    iVar1 = fclose(__s);
    bVar6 = iVar1 == 0;
    if (!bVar6) {
      puVar2 = (uint *)__errno_location();
      uVar5 = *puVar2;
      while (uVar5 == 4) {
        iVar1 = fclose(__s);
        bVar6 = iVar1 == 0;
        if (bVar6) {
          uVar5 = 4;
          break;
        }
        uVar5 = *puVar2;
      }
    }
    if (!bVar6) {
      pcVar3 = strerror(uVar5);
      logmsg("Error closing file %s error: %d %s","log/server.input",(ulong)uVar5,pcVar3);
      return;
    }
  }
  return;
}

Assistant:

static void storerequest(char *reqbuf, size_t totalsize)
{
  int res;
  int error = 0;
  size_t written;
  size_t writeleft;
  FILE *dump;

  if(reqbuf == NULL)
    return;
  if(totalsize == 0)
    return;

  do {
    dump = fopen(REQUEST_DUMP, "ab");
  } while((dump == NULL) && ((error = errno) == EINTR));
  if(dump == NULL) {
    logmsg("Error opening file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Failed to write request input to " REQUEST_DUMP);
    return;
  }

  writeleft = totalsize;
  do {
    written = fwrite(&reqbuf[totalsize-writeleft],
                     1, writeleft, dump);
    if(got_exit_signal)
      goto storerequest_cleanup;
    if(written > 0)
      writeleft -= written;
  } while((writeleft > 0) && ((error = errno) == EINTR));

  if(writeleft == 0)
    logmsg("Wrote request (%zu bytes) input to " REQUEST_DUMP, totalsize);
  else if(writeleft > 0) {
    logmsg("Error writing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",
           totalsize-writeleft, totalsize, REQUEST_DUMP);
  }

storerequest_cleanup:

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
}